

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O1

string_view absl::FindLongestCommonSuffix(string_view a,string_view b)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  string_view sVar6;
  string_view sVar7;
  
  uVar4 = a._M_len;
  uVar1 = b._M_len;
  uVar5 = uVar4;
  if (uVar1 < uVar4) {
    uVar5 = uVar1;
  }
  if (uVar5 == 0) {
    pcVar3 = (char *)0x0;
    uVar1 = 0;
  }
  else {
    pcVar3 = a._M_str + uVar4;
    pcVar2 = b._M_str + uVar1;
    uVar1 = 0;
    while (pcVar2 = pcVar2 + -1, pcVar3[-1] == *pcVar2) {
      pcVar3 = pcVar3 + -1;
      uVar1 = uVar1 + 1;
      if (uVar5 == uVar1) {
        sVar6._M_str = a._M_str + (uVar4 - uVar5);
        sVar6._M_len = uVar5;
        return sVar6;
      }
    }
  }
  sVar7._M_str = pcVar3;
  sVar7._M_len = uVar1;
  return sVar7;
}

Assistant:

absl::string_view FindLongestCommonSuffix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  if (limit == 0) return absl::string_view();

  const char* pa = a.data() + a.size() - 1;
  const char* pb = b.data() + b.size() - 1;
  absl::string_view::size_type count = (unsigned) 0;
  while (count < limit && *pa == *pb) {
    --pa;
    --pb;
    ++count;
  }

  return absl::string_view(++pa, count);
}